

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

IPAsKey * __thiscall
BinHash<IPAsKey>::DoInsert(BinHash<IPAsKey> *this,IPAsKey *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t __n;
  IPAsKey **ppIVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  uint32_t uVar6;
  IPAsKey *pIVar7;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 != 0 && key != (IPAsKey *)0x0) {
    if (key->hash == 0) {
      key->hash = 0xdeadbeef;
      if (key->addr_len != 0) {
        uVar6 = 0xdeadbeef;
        sVar5 = 0;
        do {
          uVar6 = (uint)key->addr[sVar5] + uVar6 * 0x65;
          key->hash = uVar6;
          sVar5 = sVar5 + 1;
        } while (key->addr_len != sVar5);
      }
    }
    uVar3 = (ulong)key->hash % (ulong)uVar1;
    pIVar7 = this->hashBin[uVar3];
    if (pIVar7 != (IPAsKey *)0x0) {
      __n = key->addr_len;
      do {
        if ((pIVar7->addr_len == __n) && (iVar4 = bcmp(pIVar7->addr,key->addr,__n), iVar4 == 0)) {
          (*pIVar7->_vptr_IPAsKey[3])(pIVar7,key);
          *stored = false;
          return pIVar7;
        }
        pIVar7 = pIVar7->HashNext;
      } while (pIVar7 != (IPAsKey *)0x0);
    }
    if (need_alloc) {
      iVar4 = (*key->_vptr_IPAsKey[2])(key);
      key = (IPAsKey *)CONCAT44(extraout_var,iVar4);
    }
    if (key != (IPAsKey *)0x0) {
      ppIVar2 = this->hashBin;
      key->HashNext = ppIVar2[uVar3];
      ppIVar2[uVar3] = key;
      *stored = true;
      this->tableCount = this->tableCount + 1;
      return key;
    }
  }
  return (IPAsKey *)0x0;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }